

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMutexTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_SimpleMutexTest_LockUnlockTest_TestShell::createTest
          (TEST_SimpleMutexTest_LockUnlockTest_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleMutexTest.cpp"
                                  ,0x5c);
  this_00->_vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_003529a8;
  return this_00;
}

Assistant:

TEST(SimpleMutexTest, LockUnlockTest)
{
    {
        SimpleMutex mtx;
        mtx.Lock();
        mtx.Unlock();
    }

    CHECK_EQUAL(1, mutexCreateCount);
    CHECK_EQUAL(1, mutexLockCount);
    CHECK_EQUAL(1, mutexUnlockCount);
    CHECK_EQUAL(1, mutexDestroyCount);
}